

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

int __thiscall Map<int,_int>::remove(Map<int,_int> *this,char *__filename)

{
  Item *pIVar1;
  Item *pIVar2;
  usize uVar3;
  usize uVar4;
  code *pcVar5;
  int iVar6;
  Item *pIVar7;
  Item *pIVar8;
  Item *pIVar9;
  undefined8 uVar10;
  Iterator *pIVar11;
  Item *pIVar12;
  Item **ppIVar13;
  Item *pIVar14;
  
  pIVar1 = *(Item **)__filename;
  pIVar7 = pIVar1->parent;
  if (pIVar7 == (Item *)0x0) {
    ppIVar13 = &this->root;
  }
  else {
    ppIVar13 = &pIVar7->right;
    if (pIVar1 == pIVar7->left) {
      ppIVar13 = &pIVar7->left;
    }
  }
  if ((*ppIVar13 != pIVar1) &&
     (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0xc9,"*cell == item"), iVar6 != 0)) goto LAB_001073f8;
  pIVar8 = pIVar1->left;
  pIVar12 = pIVar1->right;
  pIVar14 = pIVar7;
  if (pIVar8 == (Item *)0x0 && pIVar12 == (Item *)0x0) {
    *ppIVar13 = (Item *)0x0;
    goto LAB_001071c0;
  }
  if (pIVar8 == (Item *)0x0) {
    *ppIVar13 = pIVar12;
    pIVar12->parent = pIVar7;
    goto LAB_001071c0;
  }
  if (pIVar12 == (Item *)0x0) {
    *ppIVar13 = pIVar8;
    pIVar8->parent = pIVar7;
    goto LAB_001071c0;
  }
  if (pIVar8->height < pIVar12->height) {
    pIVar9 = pIVar1->next;
    if ((pIVar9->left != (Item *)0x0) &&
       (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0xe4,"!next->left"), iVar6 != 0)) goto LAB_001073f8;
    pIVar14 = pIVar9->parent;
    if (pIVar14 == pIVar1) {
      if ((pIVar9 != pIVar12) &&
         (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0xe8,"next == right"), iVar6 != 0)) goto LAB_001073f8;
      *ppIVar13 = pIVar9;
      pIVar9->parent = pIVar7;
      pIVar9->left = pIVar8;
      pIVar12 = pIVar8;
LAB_00107377:
      pIVar12->parent = pIVar9;
      pIVar14 = pIVar9;
    }
    else {
      if ((pIVar9 != pIVar14->left) &&
         (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0xf3,"next == nextParent->left"), iVar6 != 0)) goto LAB_001073f8;
      pIVar2 = pIVar9->right;
      pIVar14->left = pIVar2;
      if (pIVar2 != (Item *)0x0) {
        pIVar2->parent = pIVar14;
      }
      *ppIVar13 = pIVar9;
      pIVar9->parent = pIVar7;
      pIVar9->left = pIVar8;
      pIVar8->parent = pIVar9;
      pIVar9->right = pIVar12;
      pIVar12->parent = pIVar9;
      if (pIVar14 == (Item *)0x0) {
        uVar10 = 0x107;
LAB_001073a0:
        iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,uVar10,"parent");
        if (iVar6 != 0) {
LAB_001073f8:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
      }
    }
  }
  else {
    pIVar9 = pIVar1->prev;
    if ((pIVar9->right != (Item *)0x0) &&
       (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x10d,"!prev->right"), iVar6 != 0)) goto LAB_001073f8;
    pIVar14 = pIVar9->parent;
    if (pIVar14 == pIVar1) {
      if ((pIVar9 != pIVar8) &&
         (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x111,"prev == left"), iVar6 != 0)) goto LAB_001073f8;
      *ppIVar13 = pIVar9;
      pIVar9->parent = pIVar7;
      pIVar9->right = pIVar12;
      goto LAB_00107377;
    }
    if ((pIVar9 != pIVar14->right) &&
       (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x11c,"prev == prevParent->right"), iVar6 != 0)) goto LAB_001073f8;
    pIVar2 = pIVar9->left;
    pIVar14->right = pIVar2;
    if (pIVar2 != (Item *)0x0) {
      pIVar2->parent = pIVar14;
    }
    *ppIVar13 = pIVar9;
    pIVar9->parent = pIVar7;
    pIVar9->right = pIVar12;
    pIVar12->parent = pIVar9;
    pIVar9->left = pIVar8;
    pIVar8->parent = pIVar9;
    if (pIVar14 == (Item *)0x0) {
      uVar10 = 0x130;
      goto LAB_001073a0;
    }
  }
  do {
    uVar3 = pIVar14->height;
    Item::updateHeightAndSlope(pIVar14);
    pIVar8 = rebal(this,pIVar14);
    uVar4 = pIVar8->height;
    if (uVar3 == uVar4) {
      pIVar8 = *ppIVar13;
      Item::updateHeightAndSlope(pIVar8);
      pIVar8 = rebal(this,pIVar8);
    }
    pIVar14 = pIVar8->parent;
  } while ((uVar3 != uVar4) && (pIVar14 != pIVar7));
LAB_001071c0:
  while (pIVar14 != (Item *)0x0) {
    uVar3 = pIVar14->height;
    Item::updateHeightAndSlope(pIVar14);
    pIVar7 = rebal(this,pIVar14);
    if (uVar3 == pIVar7->height) break;
    pIVar14 = pIVar7->parent;
  }
  pIVar7 = pIVar1->next;
  pIVar8 = pIVar1->prev;
  pIVar11 = (Iterator *)&pIVar8->next;
  if (pIVar8 == (Item *)0x0) {
    pIVar11 = &this->_begin;
  }
  pIVar11->item = pIVar7;
  pIVar7->prev = pIVar8;
  this->_size = this->_size - 1;
  pIVar1->prev = this->freeItem;
  this->freeItem = pIVar1;
  return (int)pIVar1->next;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;
    Item* origParent;
    Item* parent = origParent = item->parent;
    Item** cell = parent ? (item == parent->left ? &parent->left : &parent->right) : &root;
    ASSERT(*cell == item);
    Item* left = item->left;
    Item* right = item->right;

    if(!left && !right)
    {
      *cell = 0;
      goto rebalParentUpwards;
    }

    if(!left)
    {
      *cell = right;
      right->parent = parent;
      goto rebalParentUpwards;
    }

    if(!right)
    {
      *cell = left;
      left->parent = parent;
      goto rebalParentUpwards;
    }

    if(left->height < right->height)
    {
      Item* next = item->next;
      ASSERT(!next->left);
      Item* nextParent = next->parent;
      if(nextParent == item)
      {
        ASSERT(next == right);
        *cell = next;
        next->parent = parent;

        next->left = left;
        left->parent = next;
        parent = next;
        goto rebalParent;
      }

      // unlink next
      ASSERT(next == nextParent->left);
      Item* nextRight = next->right;
      nextParent->left = nextRight;
      if(nextRight)
        nextRight->parent = nextParent;
      
      // put next in cell
      *cell = next;
      next->parent = parent;

      // link left to next left
      next->left = left;
      left->parent = next;

      // link right to next right
      next->right = right;
      right->parent = next;

      // rebal old next->parent
      parent = nextParent;
      ASSERT(parent);
      goto rebalParent;
    }
    else
    {
      Item* prev = item->prev;
      ASSERT(!prev->right);
      Item* prevParent = prev->parent;
      if(prevParent == item)
      {
        ASSERT(prev == left);
        *cell = prev;
        prev->parent = parent;

        prev->right = right;
        right->parent = prev;
        parent = prev;
        goto rebalParent;
      }

      // unlink prev
      ASSERT(prev == prevParent->right);
      Item* prevLeft = prev->left;
      prevParent->right = prevLeft;
      if(prevLeft)
        prevLeft->parent = prevParent;

      // put prev in cell
      *cell = prev;
      prev->parent = parent;

      // link right to prev right
      prev->right = right;
      right->parent = prev;

      // link left to prev left
      prev->left = left;
      left->parent = prev;

      // rebal old prev->parent
      parent = prevParent;
      ASSERT(parent);
      goto rebalParent;
    }

    // rebal parent upwards
  rebalParent:
    do
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
      {
        parent = *cell;
        parent->updateHeightAndSlope();
        parent = rebal(parent);
        parent = parent->parent;
        break;
      }
      parent = parent->parent;
    } while(parent != origParent);
  rebalParentUpwards:
    while(parent)
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
        break;
      parent = parent->parent;
    }

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;
    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }